

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::handle_condition_options(vw *all,auto_condition_settings *acset)

{
  typed_option<unsigned_long> *ptVar1;
  typed_option<float> *ptVar2;
  allocator local_432;
  allocator local_431;
  string local_430 [32];
  option_group_definition new_options;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  undefined1 local_338 [112];
  bool local_2c8;
  typed_option<bool> local_298;
  typed_option<float> local_1f8;
  typed_option<unsigned_long> local_158;
  typed_option<unsigned_long> local_b8;
  
  std::__cxx11::string::string
            ((string *)&local_358,"Search Auto-conditioning Options",(allocator *)local_338);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::string((string *)&local_378,"search_max_bias_ngram_length",&local_431);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_338,&local_378,&acset->max_bias_ngram_length);
  local_2c8 = true;
  ptVar1 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_338,1);
  std::__cxx11::string::string
            (local_430,
             "add a \"bias\" feature for each ngram up to and including this length. eg., if it\'s 1 (default), then you get a single feature for each conditional"
             ,&local_432);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_b8,ptVar1);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_b8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_b8);
  std::__cxx11::string::~string(local_430);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_338);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string((string *)&local_398,"search_max_quad_ngram_length",&local_431);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_338,&local_398,&acset->max_quad_ngram_length);
  local_2c8 = true;
  ptVar1 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_338,0);
  std::__cxx11::string::string
            (local_430,
             "add bias *times* input features for each ngram up to and including this length (def: 0)"
             ,&local_432);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_158,ptVar1);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_158);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_158);
  std::__cxx11::string::~string(local_430);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_338);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_3b8,"search_condition_feature_value",&local_431);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_338,&local_3b8,&acset->feature_value);
  local_2c8 = true;
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_338,1.0);
  std::__cxx11::string::string
            (local_430,"how much weight should the conditional features get? (def: 1.)",&local_432);
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_1f8,ptVar2);
  VW::config::option_group_definition::add<float>(&new_options,&local_1f8);
  VW::config::typed_option<float>::~typed_option(&local_1f8);
  std::__cxx11::string::~string(local_430);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_338);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3d8,"search_use_passthrough_repr",&local_431);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_338,&local_3d8,&acset->use_passthrough_repr);
  local_2c8 = true;
  std::__cxx11::string::string
            (local_430,
             "should we use lower-level reduction _internal state_ as additional features? (def: no)"
             ,&local_432);
  std::__cxx11::string::_M_assign((string *)(local_338 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_298,(typed_option<bool> *)local_338);
  VW::config::option_group_definition::add<bool>(&new_options,&local_298);
  VW::config::typed_option<bool>::~typed_option(&local_298);
  std::__cxx11::string::~string(local_430);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_338);
  std::__cxx11::string::~string((string *)&local_3d8);
  (**all->options->_vptr_options_i)(all->options,&new_options);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void handle_condition_options(vw& all, auto_condition_settings& acset)
{
  option_group_definition new_options("Search Auto-conditioning Options");
  new_options.add(make_option("search_max_bias_ngram_length", acset.max_bias_ngram_length)
                      .keep()
                      .default_value(1)
                      .help("add a \"bias\" feature for each ngram up to and including this length. eg., if it's 1 "
                            "(default), then you get a single feature for each conditional"));
  new_options.add(make_option("search_max_quad_ngram_length", acset.max_quad_ngram_length)
                      .keep()
                      .default_value(0)
                      .help("add bias *times* input features for each ngram up to and including this length (def: 0)"));
  new_options.add(make_option("search_condition_feature_value", acset.feature_value)
                      .keep()
                      .default_value(1.f)
                      .help("how much weight should the conditional features get? (def: 1.)"));
  new_options.add(make_option("search_use_passthrough_repr", acset.use_passthrough_repr)
                      .keep()
                      .help("should we use lower-level reduction _internal state_ as additional features? (def: no)"));
  all.options->add_and_parse(new_options);
}